

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

uint * fetchTransformedBilinear<(TextureBlendType)5,(QPixelLayout::BPP)0>
                 (uint *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  anon_union_80_2_ea1780ee_for_QSpanData_24 *image;
  double fdx;
  double fdy;
  double fdw;
  Format FVar1;
  long lVar2;
  QList<unsigned_int> *pQVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int len;
  ulong uVar7;
  uint *puVar8;
  uint *puVar9;
  uint *b;
  uint *puVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  double cx;
  double cy;
  uint uVar12;
  uint fdx_00;
  int iVar13;
  int in_stack_ffffffffffffaf38;
  undefined8 local_50b8;
  int disty;
  qreal fw;
  qreal fy;
  qreal fx;
  ushort distys [1024];
  ushort distxs [1024];
  uint buf2 [2048];
  uint buf1 [2048];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  image = &data->field_23;
  FVar1 = (data->field_23).texture.format;
  pQVar3 = (data->field_23).texture.colorTable;
  cx = (double)x + 0.5;
  cy = (double)y + 0.5;
  bVar4 = canUseFastMatrixPath(cx,cy,(long)length,data);
  fdx = data->m11;
  if (bVar4) {
    fdx_00 = (uint)(fdx * 65536.0);
    iVar13 = (int)(data->m12 * 65536.0);
    distxs._0_4_ = (int)((data->dx + data->m21 * cy + cx * fdx) * 65536.0) - 0x8000;
    uVar12 = (int)((data->dy + data->m22 * cy + cx * data->m12) * 65536.0) - 0x8000;
    puVar8 = buffer;
    distys._0_4_ = uVar12;
    local_50b8._0_4_ = distxs._0_4_;
    local_50b8._4_4_ = uVar12;
    if (iVar13 == 0) {
      uVar6 = -fdx_00;
      if (0 < (int)fdx_00) {
        uVar6 = fdx_00;
      }
      if (0x10000 < uVar6) {
        if (0x20000 < uVar6) {
          disty = uVar12 >> 8 & 0xff;
          local_50b8 = buffer;
          for (; length != 0; length = length - iVar13) {
            uVar7 = 0x400;
            if (length < 0x400) {
              uVar7 = (ulong)(uint)length;
            }
            puVar9 = buf1;
            iVar13 = (int)uVar7;
            fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)0,unsigned_int>
                      (puVar9,buf2,iVar13,&image->texture,distxs._0_4_,uVar12,fdx_00,0);
            (*qPixelLayouts[FVar1].convertToARGB32PM)(puVar9,iVar13 * 2,pQVar3);
            (*qPixelLayouts[FVar1].convertToARGB32PM)(buf2,iVar13 * 2,pQVar3);
            uVar11 = 0;
            if (0 < iVar13) {
              uVar11 = uVar7;
            }
            puVar8 = buf2;
            uVar6 = distxs._0_4_;
            for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
              uVar5 = interpolate_4_pixels(puVar9,puVar8,uVar6 >> 8 & 0xff,disty);
              local_50b8[uVar7] = uVar5;
              uVar6 = uVar6 + fdx_00;
              puVar8 = puVar8 + 2;
              puVar9 = puVar9 + 2;
            }
            local_50b8 = local_50b8 + iVar13;
            distxs._0_4_ = uVar6;
          }
          goto LAB_005b3371;
        }
        uVar12 = length + 1U >> 1;
        if (length < 0x400) {
          uVar12 = length;
        }
        fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)5>
                  (buffer,buffer + (int)uVar12,&image->texture,(int *)distxs,(int *)distys,fdx_00,
                   in_stack_ffffffffffffaf38);
        puVar8 = buffer + (int)uVar12;
        if (uVar12 == length) goto LAB_005b3371;
      }
      fetchTransformedBilinear_simple_scale_helper<(TextureBlendType)5>
                (puVar8,buffer + length,&image->texture,(int *)distxs,(int *)distys,fdx_00,
                 in_stack_ffffffffffffaf38);
    }
    else {
      for (; length != 0; length = length - len) {
        uVar7 = 0x400;
        if (length < 0x400) {
          uVar7 = (ulong)(uint)length;
        }
        len = (int)uVar7;
        fetchTransformedBilinear_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)0,unsigned_int>
                  (buf1,buf2,len,&image->texture,(uint)local_50b8,local_50b8._4_4_,fdx_00,iVar13);
        (*qPixelLayouts[FVar1].convertToARGB32PM)(buf1,len * 2,pQVar3);
        (*qPixelLayouts[FVar1].convertToARGB32PM)(buf2,len * 2,pQVar3);
        uVar11 = 0;
        if (0 < len) {
          uVar11 = uVar7;
        }
        puVar10 = buf1;
        b = buf2;
        for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
          uVar5 = interpolate_4_pixels
                            (puVar10,b,(uint)local_50b8 >> 8 & 0xff,local_50b8._4_4_ >> 8 & 0xff);
          puVar8[uVar7] = uVar5;
          local_50b8._0_4_ = (uint)local_50b8 + fdx_00;
          local_50b8._4_4_ = local_50b8._4_4_ + iVar13;
          b = b + 2;
          puVar10 = puVar10 + 2;
        }
        puVar8 = puVar8 + len;
      }
    }
  }
  else {
    fdy = data->m12;
    fdw = data->m13;
    fx = data->m21 * cy + cx * fdx + data->dx;
    fy = data->m22 * cy + cx * fdy + data->dy;
    fw = cy * data->m23 + cx * fdw + data->m33;
    puVar8 = buffer;
    for (; length != 0; length = length - iVar13) {
      uVar7 = 0x400;
      if (length < 0x400) {
        uVar7 = (ulong)(uint)length;
      }
      puVar9 = buf1;
      iVar13 = (int)uVar7;
      fetchTransformedBilinear_slow_fetcher<(TextureBlendType)5,(QPixelLayout::BPP)0,unsigned_int>
                (puVar9,buf2,distxs,distys,iVar13,&image->texture,&fx,&fy,&fw,fdx,fdy,fdw);
      (*qPixelLayouts[FVar1].convertToARGB32PM)(puVar9,iVar13 * 2,pQVar3);
      (*qPixelLayouts[FVar1].convertToARGB32PM)(buf2,iVar13 * 2,pQVar3);
      uVar11 = 0;
      if (0 < iVar13) {
        uVar11 = uVar7;
      }
      puVar10 = buf2;
      for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
        uVar5 = interpolate_4_pixels
                          (puVar9,puVar10,(uint)*(byte *)((long)distxs + uVar7 * 2 + 1),
                           (uint)*(byte *)((long)distys + uVar7 * 2 + 1));
        puVar8[uVar7] = uVar5;
        puVar10 = puVar10 + 2;
        puVar9 = puVar9 + 2;
      }
      puVar8 = puVar8 + iVar13;
    }
  }
LAB_005b3371:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return buffer;
}

Assistant:

static const uint *QT_FASTCALL fetchTransformedBilinear(uint *buffer, const Operator *,
                                                        const QSpanData *data, int y, int x, int length)
{
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    const QList<QRgb> *clut = data->texture.colorTable;
    Q_ASSERT(bpp == QPixelLayout::BPPNone || layout->bpp == bpp);

    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);

    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy + data->m12 * cx + data->dy) * fixed_scale);

        fx -= half_point;
        fy -= half_point;

        if (fdy == 0) { // simple scale, no rotation or shear
            if (qAbs(fdx) <= fixed_scale) { // scale up on X
                fetchTransformedBilinear_simple_scale_helper<blendType>(buffer, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(fdx) <= 2 * fixed_scale) { // scale down on X less than 2x
                const int mid = (length * 2 < BufferSize) ? length : ((length + 1) / 2);
                fetchTransformedBilinear_simple_scale_helper<blendType>(buffer, buffer + mid, data->texture, fx, fy, fdx, fdy);
                if (mid != length)
                    fetchTransformedBilinear_simple_scale_helper<blendType>(buffer + mid, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else {
                const auto fetcher = fetchTransformedBilinear_fetcher<blendType,bpp,uint>;

                Q_DECL_UNINITIALIZED uint buf1[BufferSize];
                Q_DECL_UNINITIALIZED uint buf2[BufferSize];
                uint *b = buffer;
                while (length) {
                    int len = qMin(length, BufferSize / 2);
                    fetcher(buf1, buf2, len, data->texture, fx, fy, fdx, 0);
                    layout->convertToARGB32PM(buf1, len * 2, clut);
                    layout->convertToARGB32PM(buf2, len * 2, clut);

                    if (hasFastInterpolate4() || qAbs(data->m22) < qreal(1./8.)) { // scale up more than 8x (on Y)
                        int disty = (fy & 0x0000ffff) >> 8;
                        for (int i = 0; i < len; ++i) {
                            int distx = (fx & 0x0000ffff) >> 8;
                            b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
                            fx += fdx;
                        }
                    } else {
                        int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;
                        for (int i = 0; i < len; ++i) {
                            uint tl = buf1[i * 2 + 0];
                            uint tr = buf1[i * 2 + 1];
                            uint bl = buf2[i * 2 + 0];
                            uint br = buf2[i * 2 + 1];
                            int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                            b[i] = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
                            fx += fdx;
                        }
                    }
                    length -= len;
                    b += len;
                }
            }
        } else { // rotation or shear
            const auto fetcher = fetchTransformedBilinear_fetcher<blendType,bpp,uint>;

            Q_DECL_UNINITIALIZED uint buf1[BufferSize];
            Q_DECL_UNINITIALIZED uint buf2[BufferSize];
            uint *b = buffer;
            while (length) {
                int len = qMin(length, BufferSize / 2);
                fetcher(buf1, buf2, len, data->texture, fx, fy, fdx, fdy);
                layout->convertToARGB32PM(buf1, len * 2, clut);
                layout->convertToARGB32PM(buf2, len * 2, clut);

                if (hasFastInterpolate4() || qAbs(data->m11) < qreal(1./8.) || qAbs(data->m22) < qreal(1./8.)) {
                    // If we are zooming more than 8 times, we use 8bit precision for the position.
                    for (int i = 0; i < len; ++i) {
                        int distx = (fx & 0x0000ffff) >> 8;
                        int disty = (fy & 0x0000ffff) >> 8;

                        b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
                        fx += fdx;
                        fy += fdy;
                    }
                } else {
                    // We are zooming less than 8x, use 4bit precision
                    for (int i = 0; i < len; ++i) {
                        uint tl = buf1[i * 2 + 0];
                        uint tr = buf1[i * 2 + 1];
                        uint bl = buf2[i * 2 + 0];
                        uint br = buf2[i * 2 + 1];

                        int distx = ((fx & 0x0000ffff) + 0x0800) >> 12;
                        int disty = ((fy & 0x0000ffff) + 0x0800) >> 12;

                        b[i] = interpolate_4_pixels_16(tl, tr, bl, br, distx, disty);
                        fx += fdx;
                        fy += fdy;
                    }
                }

                length -= len;
                b += len;
            }
        }
    } else {
        const auto fetcher = fetchTransformedBilinear_slow_fetcher<blendType,bpp,uint>;

        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        Q_DECL_UNINITIALIZED uint buf1[BufferSize];
        Q_DECL_UNINITIALIZED uint buf2[BufferSize];
        uint *b = buffer;

        Q_DECL_UNINITIALIZED ushort distxs[BufferSize / 2];
        Q_DECL_UNINITIALIZED ushort distys[BufferSize / 2];

        while (length) {
            const int len = qMin(length, BufferSize / 2);
            fetcher(buf1, buf2, distxs, distys, len, data->texture, fx, fy, fw, fdx, fdy, fdw);

            layout->convertToARGB32PM(buf1, len * 2, clut);
            layout->convertToARGB32PM(buf2, len * 2, clut);

            for (int i = 0; i < len; ++i) {
                const int distx = distxs[i] >> 8;
                const int disty = distys[i] >> 8;

                b[i] = interpolate_4_pixels(buf1 + i * 2, buf2 + i * 2, distx, disty);
            }
            length -= len;
            b += len;
        }
    }

    return buffer;
}